

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-sha512.c
# Opt level: O3

_Bool ed25519_verify(uint8_t *sig,uint8_t *pub,uint8_t *data,size_t len)

{
  int i;
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  sc_t S;
  sc_t t;
  uint8_t check [32];
  ed A;
  uint8_t h [64];
  ed C;
  sha512 hash;
  limb_t alStack_2f8 [6];
  limb_t local_2c8 [6];
  uint8_t local_298;
  uint8_t uStack_297;
  uint8_t uStack_296;
  uint8_t uStack_295;
  uint8_t uStack_294;
  uint8_t uStack_293;
  uint8_t uStack_292;
  uint8_t uStack_291;
  uint8_t uStack_290;
  uint8_t uStack_28f;
  uint8_t uStack_28e;
  uint8_t uStack_28d;
  uint8_t uStack_28c;
  uint8_t uStack_28b;
  uint8_t uStack_28a;
  uint8_t uStack_289;
  uint8_t local_288;
  uint8_t uStack_287;
  uint8_t uStack_286;
  uint8_t uStack_285;
  uint8_t uStack_284;
  uint8_t uStack_283;
  uint8_t uStack_282;
  uint8_t uStack_281;
  uint8_t uStack_280;
  uint8_t uStack_27f;
  uint8_t uStack_27e;
  uint8_t uStack_27d;
  uint8_t uStack_27c;
  uint8_t uStack_27b;
  uint8_t uStack_27a;
  uint8_t uStack_279;
  ed local_278;
  uint8_t local_1d8 [64];
  ed local_198;
  sha512 local_f8;
  
  ed_import(&local_278,pub);
  sc_import(alStack_2f8,sig + 0x20,0x20);
  sha512_init(&local_f8);
  sha512_add(&local_f8,sig,0x20);
  sha512_add(&local_f8,pub,0x20);
  sha512_add(&local_f8,data,len);
  sha512_final(&local_f8,local_1d8);
  sc_import(local_2c8,local_1d8,0x40);
  lVar1 = 0;
  do {
    local_278.x[lVar1] = -local_278.x[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  lVar1 = 10;
  do {
    local_278.x[lVar1] = -local_278.x[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xf);
  ed_dual_scale(&local_198,alStack_2f8,local_2c8,&local_278);
  ed_export(&local_298,&local_198);
  auVar2[0] = -(sig[0x10] == local_288);
  auVar2[1] = -(sig[0x11] == uStack_287);
  auVar2[2] = -(sig[0x12] == uStack_286);
  auVar2[3] = -(sig[0x13] == uStack_285);
  auVar2[4] = -(sig[0x14] == uStack_284);
  auVar2[5] = -(sig[0x15] == uStack_283);
  auVar2[6] = -(sig[0x16] == uStack_282);
  auVar2[7] = -(sig[0x17] == uStack_281);
  auVar2[8] = -(sig[0x18] == uStack_280);
  auVar2[9] = -(sig[0x19] == uStack_27f);
  auVar2[10] = -(sig[0x1a] == uStack_27e);
  auVar2[0xb] = -(sig[0x1b] == uStack_27d);
  auVar2[0xc] = -(sig[0x1c] == uStack_27c);
  auVar2[0xd] = -(sig[0x1d] == uStack_27b);
  auVar2[0xe] = -(sig[0x1e] == uStack_27a);
  auVar2[0xf] = -(sig[0x1f] == uStack_279);
  auVar3[0] = -(*sig == local_298);
  auVar3[1] = -(sig[1] == uStack_297);
  auVar3[2] = -(sig[2] == uStack_296);
  auVar3[3] = -(sig[3] == uStack_295);
  auVar3[4] = -(sig[4] == uStack_294);
  auVar3[5] = -(sig[5] == uStack_293);
  auVar3[6] = -(sig[6] == uStack_292);
  auVar3[7] = -(sig[7] == uStack_291);
  auVar3[8] = -(sig[8] == uStack_290);
  auVar3[9] = -(sig[9] == uStack_28f);
  auVar3[10] = -(sig[10] == uStack_28e);
  auVar3[0xb] = -(sig[0xb] == uStack_28d);
  auVar3[0xc] = -(sig[0xc] == uStack_28c);
  auVar3[0xd] = -(sig[0xd] == uStack_28b);
  auVar3[0xe] = -(sig[0xe] == uStack_28a);
  auVar3[0xf] = -(sig[0xf] == uStack_289);
  auVar3 = auVar3 & auVar2;
  return (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) == 0xffff;
}

Assistant:

bool
ed25519_verify(const uint8_t sig[ED25519_SIG_LEN],
	       const uint8_t pub[ED25519_KEY_LEN],
	       const uint8_t *data, size_t len)
{
	struct sha512 hash;
	uint8_t h[SHA512_HASH_LENGTH];
	struct ed A, C;
	sc_t t, S;
	uint8_t check[32];

	/* import public key */
	ed_import(&A, pub);

	/* import S from second half of the signature */
	sc_import(S, sig+32, 32);

	/* calculate t := Hash(export(R), export(A), data) mod m */
	sha512_init(&hash);
	sha512_add(&hash, sig, 32);
	sha512_add(&hash, pub, 32);
	sha512_add(&hash, data, len);
	sha512_final(&hash, h);
	sc_import(t, h, 64);

	/* verify signature (vartime!) */
	fld_neg(A.x, A.x);
	fld_neg(A.t, A.t);
	ed_dual_scale(&C, S, t, &A);
	ed_export(check, &C);
	
	/* is export(C) == export(R) (vartime!) */
	return (memcmp(check, sig, 32) == 0);
}